

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float16 float16_round_to_int_arm(float16 a,float_status *s)

{
  FloatParts FVar1;
  
  FVar1._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar1.frac = (ulong)(a & 0x3ff);
  FVar1 = sf_canonicalize(FVar1,&float16_params,s);
  FVar1 = round_to_int(FVar1,(int)s->float_rounding_mode,0,s);
  FVar1 = round_canonical(FVar1,s,&float16_params);
  return (ushort)FVar1.frac & 0x3ff | (ushort)((FVar1.exp & 0x1fU) << 10) |
         (ushort)(FVar1._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 float16_round_to_int(float16 a, float_status *s)
{
    FloatParts pa = float16_unpack_canonical(a, s);
    FloatParts pr = round_to_int(pa, s->float_rounding_mode, 0, s);
    return float16_round_pack_canonical(pr, s);
}